

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O2

ChVector<double> * __thiscall
chrono::utils::MixtureIngredient::getSize
          (ChVector<double> *__return_storage_ptr__,MixtureIngredient *this)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar5 [16];
  
  if (this->m_sizeDist == (normal_distribution<double> *)0x0) {
    auVar5 = *(undefined1 (*) [16])(this->m_defSize).m_data;
    dVar4 = (this->m_defSize).m_data[2];
  }
  else {
    dVar2 = sampleTruncatedDist<double>
                      (this->m_sizeDist,(this->m_minSize).m_data[0],(this->m_maxSize).m_data[0]);
    dVar3 = sampleTruncatedDist<double>
                      (this->m_sizeDist,(this->m_minSize).m_data[1],(this->m_maxSize).m_data[1]);
    dVar4 = sampleTruncatedDist<double>
                      (this->m_sizeDist,(this->m_minSize).m_data[2],(this->m_maxSize).m_data[2]);
    auVar1._8_8_ = extraout_XMM0_Qb;
    auVar1._0_8_ = dVar2;
    auVar5._8_8_ = extraout_XMM0_Qb_00;
    auVar5._0_8_ = dVar3;
    auVar5 = vunpcklpd_avx(auVar1,auVar5);
  }
  *(undefined1 (*) [16])__return_storage_ptr__->m_data = auVar5;
  __return_storage_ptr__->m_data[2] = dVar4;
  return __return_storage_ptr__;
}

Assistant:

ChVector<> MixtureIngredient::getSize() {
    if (m_sizeDist)
        return ChVector<>(sampleTruncatedDist<double>(*m_sizeDist, m_minSize.x(), m_maxSize.x()),
                          sampleTruncatedDist<double>(*m_sizeDist, m_minSize.y(), m_maxSize.y()),
                          sampleTruncatedDist<double>(*m_sizeDist, m_minSize.z(), m_maxSize.z()));

    return m_defSize;
}